

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

double units::generateLeadingNumber(string *ustring,size_t *index)

{
  ulong uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  char *pcVar6;
  double dVar7;
  string local_88;
  double local_68;
  double res_1;
  size_t oindex_1;
  double local_38;
  double res;
  size_t oindex;
  double val;
  size_t *index_local;
  string *ustring_local;
  
  *index = 0;
  val = (double)index;
  index_local = (size_t *)ustring;
  oindex = (size_t)getNumberBlock(ustring,index);
  uVar3 = std::isnan((double)oindex);
  if ((uVar3 & 1) == 0) {
    while (uVar1 = *(ulong *)val, uVar5 = std::__cxx11::string::size(), uVar1 < uVar5) {
      pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)index_local);
      iVar4 = (int)*pcVar6;
      if (iVar4 == 0x28) {
        res_1 = 0.0;
        std::__cxx11::string::substr((ulong)&local_88,(ulong)index_local);
        dVar7 = getNumberBlock(&local_88,(size_t *)&res_1);
        std::__cxx11::string::~string((string *)&local_88);
        local_68 = dVar7;
        uVar3 = std::isnan(dVar7);
        if ((uVar3 & 1) != 0) {
          return (double)oindex;
        }
        oindex = (size_t)(local_68 * (double)oindex);
        *(long *)val = (long)res_1 + *(long *)val + 1;
      }
      else {
        if (iVar4 != 0x2a) {
          if ((iVar4 == 0x2b) || (iVar4 - 0x2dU < 2)) {
            *(undefined8 *)val = 0;
            return NAN;
          }
          if ((iVar4 != 0x2f) && (iVar4 != 0x78)) {
            return (double)oindex;
          }
        }
        bVar2 = looksLikeNumber((string *)index_local,*(long *)val + 1);
        if ((!bVar2) &&
           (pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)index_local), *pcVar6 != '('))
        {
          return (double)oindex;
        }
        res = 0.0;
        std::__cxx11::string::substr((ulong)&oindex_1,(ulong)index_local);
        dVar7 = getNumberBlock((string *)&oindex_1,(size_t *)&res);
        std::__cxx11::string::~string((string *)&oindex_1);
        local_38 = dVar7;
        uVar3 = std::isnan(dVar7);
        if ((uVar3 & 1) != 0) {
          return (double)oindex;
        }
        pcVar6 = (char *)std::__cxx11::string::operator[]((ulong)index_local);
        if (*pcVar6 == '/') {
          oindex = (size_t)((double)oindex / local_38);
        }
        else {
          oindex = (size_t)(local_38 * (double)oindex);
        }
        *(long *)val = (long)res + *(long *)val + 1;
      }
    }
    ustring_local = (string *)oindex;
  }
  else {
    *(undefined8 *)val = 0;
    ustring_local = (string *)oindex;
  }
  return (double)ustring_local;
}

Assistant:

double generateLeadingNumber(const std::string& ustring, size_t& index) noexcept
{
    index = 0;
    double val = getNumberBlock(ustring, index);
    if (std::isnan(val)) {
        index = 0;
        return val;
    }
    while (true) {
        if (index >= ustring.size()) {
            return val;
        }
        switch (ustring[index]) {
            case '.':
            case '-':
            case '+':
                index = 0;
                return constants::invalid_conversion;
            case '/':
            case '*':
            case 'x':
                if (looksLikeNumber(ustring, index + 1) ||
                    ustring[index + 1] == '(') {
                    size_t oindex{0};
                    double res =
                        getNumberBlock(ustring.substr(index + 1), oindex);
                    if (!std::isnan(res)) {
                        if (ustring[index] == '/') {
                            val /= res;
                        } else {
                            val *= res;
                        }

                        index = oindex + index + 1;
                    } else {
                        return val;
                    }
                } else {
                    return val;
                }
                break;
            case '(': {
                size_t oindex{0};
                double res = getNumberBlock(ustring.substr(index), oindex);
                if (!std::isnan(res)) {
                    val *= res;
                    index = oindex + index + 1;
                } else {
                    return val;
                }
                break;
            }
            default:
                return val;
        }
    }
}